

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.cpp
# Opt level: O2

ScalarFunction * duckdb::ReplaceFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff1c;
  FunctionNullHandling in_stack_ffffffffffffff28;
  allocator_type local_d1;
  code *bind_lambda;
  LogicalType local_b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_80;
  LogicalType local_68 [3];
  
  LogicalType::LogicalType(local_68,VARCHAR);
  LogicalType::LogicalType(local_68 + 1,VARCHAR);
  LogicalType::LogicalType(local_68 + 2,VARCHAR);
  __l._M_len = 3;
  __l._M_array = local_68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_98,__l,&local_d1);
  LogicalType::LogicalType(&local_b0,VARCHAR);
  bind_lambda = ReplaceFunction;
  LogicalType::LogicalType(&local_80,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_80;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff14;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff1c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_98,&local_b0,
             (scalar_function_t *)&stack0xffffffffffffff30,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff28,bind_lambda);
  LogicalType::~LogicalType(&local_80);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff30);
  LogicalType::~LogicalType(&local_b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_68[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunction ReplaceFun::GetFunction() {
	return ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                      ReplaceFunction);
}